

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderPackingFunctionTests.cpp
# Opt level: O1

void __thiscall
vkt::shaderexecutor::ShaderPackingFunctionTestInstance::~ShaderPackingFunctionTestInstance
          (ShaderPackingFunctionTestInstance *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ShaderExecutor *pSVar2;
  pointer pcVar3;
  
  (this->super_TestInstance)._vptr_TestInstance =
       (_func_int **)&PTR__ShaderPackingFunctionTestInstance_00d345d8;
  pSVar2 = (this->m_executor).
           super_UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
           .m_data.ptr;
  if (pSVar2 != (ShaderExecutor *)0x0) {
    (*pSVar2->_vptr_ShaderExecutor[1])();
    (this->m_executor).
    super_UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
    .m_data.ptr = (ShaderExecutor *)0x0;
  }
  pcVar3 = (this->m_spec).source._M_dataplus._M_p;
  paVar1 = &(this->m_spec).source.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  pcVar3 = (this->m_spec).globalDeclarations._M_dataplus._M_p;
  paVar1 = &(this->m_spec).globalDeclarations.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::~vector
            (&(this->m_spec).outputs);
  std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::~vector
            (&(this->m_spec).inputs);
  return;
}

Assistant:

ShaderPackingFunctionTestInstance	(Context& context, glu::ShaderType shaderType, const ShaderSpec& spec, const char* name)
											: TestInstance	(context)
											, m_testCtx		(context.getTestContext())
											, m_shaderType	(shaderType)
											, m_spec		(spec)
											, m_name		(name)
											, m_executor	(createExecutor(context, m_shaderType, m_spec))
										{
										}